

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  long lVar1;
  FieldDescriptor *this;
  pointer ppFVar2;
  bool bVar3;
  FieldDescriptor FVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  Reflection *this_00;
  long lVar7;
  Descriptor *pDVar8;
  MapFieldBase *this_01;
  Message *pMVar9;
  int index;
  long lVar10;
  pointer ppFVar11;
  MapIterator iter;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator end;
  MapIterator local_e0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_98;
  MapIterator local_78;
  
  iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])();
  this_00 = GetReflectionOrDie(message);
  lVar7 = (long)*(int *)(CONCAT44(extraout_var,iVar5) + 4);
  if (0 < lVar7) {
    lVar10 = 0;
    do {
      lVar1 = *(long *)(CONCAT44(extraout_var,iVar5) + 0x28);
      if (((*(byte *)(lVar1 + 1 + lVar10) & 0x60) == 0x40) &&
         (bVar3 = Reflection::HasField(this_00,message,(FieldDescriptor *)(lVar1 + lVar10)), !bVar3)
         ) {
        return false;
      }
      lVar10 = lVar10 + 0x48;
    } while (lVar7 * 0x48 != lVar10);
  }
  local_98.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFieldsOmitStripped(this_00,message,&local_98);
  ppFVar2 = local_98.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppFVar11 = local_98.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_98.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_98.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = true;
  }
  else {
    do {
      this = *ppFVar11;
      if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
        local_e0.iter_ = FieldDescriptor::TypeOnceInit;
        local_78.iter_ = this;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)&local_e0,
                   (FieldDescriptor **)&local_78);
      }
      FVar4 = this[2];
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)FVar4 * 4) == 10) {
        if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
          local_e0.iter_ = FieldDescriptor::TypeOnceInit;
          local_78.iter_ = this;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)&local_e0,
                     (FieldDescriptor **)&local_78);
          FVar4 = this[2];
        }
        if ((FVar4 == (FieldDescriptor)0xb) &&
           (bVar3 = FieldDescriptor::is_map_message_type(this), bVar3)) {
          pDVar8 = FieldDescriptor::message_type(this);
          lVar7 = *(long *)(pDVar8 + 0x28);
          if (*(once_flag **)(lVar7 + 0x60) != (once_flag *)0x0) {
            local_78.iter_ = (void *)(lVar7 + 0x48);
            local_e0.iter_ = FieldDescriptor::TypeOnceInit;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(lVar7 + 0x60),(_func_void_FieldDescriptor_ptr **)&local_e0,
                       (FieldDescriptor **)&local_78);
          }
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(byte *)(lVar7 + 0x4a) * 4) ==
              10) {
            this_01 = Reflection::GetMapData(this_00,message,this);
            bVar3 = MapFieldBase::IsMapValid(this_01);
            if (!bVar3) goto LAB_003ac664;
            MapIterator::MapIterator(&local_e0,message,this);
            MapIterator::MapIterator(&local_78,message,this);
            (*this_01->_vptr_MapFieldBase[7])(this_01,&local_e0);
            (*this_01->_vptr_MapFieldBase[8])(this_01,&local_78);
            while (iVar5 = (*(local_e0.map_)->_vptr_MapFieldBase[6])
                                     (local_e0.map_,&local_e0,&local_78), (char)iVar5 == '\0') {
              pMVar9 = MapValueConstRef::GetMessageValue(&local_e0.value_.super_MapValueConstRef);
              iVar5 = (*(pMVar9->super_MessageLite)._vptr_MessageLite[5])(pMVar9);
              if ((char)iVar5 == '\0') {
                MapIterator::~MapIterator(&local_78);
                MapIterator::~MapIterator(&local_e0);
                goto LAB_003ac711;
              }
              (*(local_e0.map_)->_vptr_MapFieldBase[0x14])(local_e0.map_,&local_e0);
            }
            MapIterator::~MapIterator(&local_78);
            MapIterator::~MapIterator(&local_e0);
          }
        }
        else {
LAB_003ac664:
          if ((~(byte)this[1] & 0x60) == 0) {
            iVar5 = Reflection::FieldSize(this_00,message,this);
            if (0 < iVar5) {
              index = 0;
              do {
                pMVar9 = Reflection::GetRepeatedMessage(this_00,message,this,index);
                iVar6 = (*(pMVar9->super_MessageLite)._vptr_MessageLite[5])(pMVar9);
                if ((char)iVar6 == '\0') goto LAB_003ac711;
                index = index + 1;
              } while (iVar5 != index);
            }
          }
          else {
            pMVar9 = Reflection::GetMessage(this_00,message,this,(MessageFactory *)0x0);
            iVar5 = (*(pMVar9->super_MessageLite)._vptr_MessageLite[5])(pMVar9);
            if ((char)iVar5 == '\0') {
LAB_003ac711:
              bVar3 = false;
              goto LAB_003ac718;
            }
          }
        }
      }
      ppFVar11 = ppFVar11 + 1;
    } while (ppFVar11 != ppFVar2);
    bVar3 = true;
  }
LAB_003ac718:
  if (local_98.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);

  // Check required fields of this message.
  {
    const int field_count = descriptor->field_count();
    for (int i = 0; i < field_count; i++) {
      if (descriptor->field(i)->is_required()) {
        if (!reflection->HasField(message, descriptor->field(i))) {
          return false;
        }
      }
    }
  }

  // Check that sub-messages are initialized.
  std::vector<const FieldDescriptor*> fields;
  // Should be safe to skip stripped fields because required fields are not
  // stripped.
  reflection->ListFieldsOmitStripped(message, &fields);
  for (const FieldDescriptor* field : fields) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_map()) {
        const FieldDescriptor* value_field = field->message_type()->field(1);
        if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const MapFieldBase* map_field =
              reflection->GetMapData(message, field);
          if (map_field->IsMapValid()) {
            MapIterator iter(const_cast<Message*>(&message), field);
            MapIterator end(const_cast<Message*>(&message), field);
            for (map_field->MapBegin(&iter), map_field->MapEnd(&end);
                 iter != end; ++iter) {
              if (!iter.GetValueRef().GetMessageValue().IsInitialized()) {
                return false;
              }
            }
            continue;
          }
        } else {
          continue;
        }
      }

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                   .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}